

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O0

int __thiscall Centaurus::ChaserEM64T<char>::init(ChaserEM64T<char> *this,EVP_PKEY_CTX *ctx)

{
  uint32_t uVar1;
  long lVar2;
  Grammar<char> *pGVar3;
  bool bVar4;
  int iVar5;
  int extraout_EAX;
  mapped_type *pmVar6;
  ulong uVar7;
  reference pvVar8;
  size_type sVar9;
  mapped_type *pp_Var10;
  reference pp_Var11;
  socklen_t __len;
  ErrorHandler *in_RCX;
  long in_RDX;
  undefined8 uVar12;
  sockaddr *__addr;
  Data128 DVar13;
  CodeHolder *in_stack_fffffffffffff978;
  X86Assembler *in_stack_fffffffffffff980;
  mapped_type p_Var14;
  Logger *in_stack_fffffffffffff988;
  undefined4 in_stack_fffffffffffff990;
  undefined4 in_stack_fffffffffffff994;
  Assembler *in_stack_fffffffffffff998;
  int id;
  value_type *p_3;
  const_iterator __end0_3;
  const_iterator __begin0_3;
  Grammar<char> *__range2_3;
  value_type *p_2;
  const_iterator __end0_2;
  const_iterator __begin0_2;
  Grammar<char> *__range2_2;
  char *func_base;
  undefined4 local_560;
  undefined4 local_55c;
  undefined8 local_558;
  undefined4 local_550;
  undefined4 local_54c;
  undefined1 local_548 [8];
  Label rejectlabel;
  value_type *p_1;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  Grammar<char> *__range2_1;
  CompositeATN<char> catn;
  undefined1 local_4c0 [8];
  X86Mem skipfilter_mem;
  MyConstPool pool;
  Label local_388;
  pair<Centaurus::Identifier,_asmjit::Label> local_378;
  reference local_340;
  value_type *p;
  const_iterator __end0;
  _Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_true>
  local_320;
  const_iterator __begin0;
  Grammar<char> *__range2;
  X86Assembler as;
  unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
  machinelabels;
  ErrorHandler *errhandler_local;
  Logger *logger_local;
  Grammar<char> *grammar_local;
  ChaserEM64T<char> *this_local;
  uint32_t signature;
  uint32_t signature_1;
  size_t index;
  
  asmjit::CodeHolder::init
            (&this->m_code,
             (EVP_PKEY_CTX *)&(this->m_runtime).super_HostRuntime.super_Runtime._codeInfo);
  if (in_RDX != 0) {
    asmjit::CodeHolder::setLogger
              ((CodeHolder *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
               in_stack_fffffffffffff988);
  }
  if (in_RCX != (ErrorHandler *)0x0) {
    asmjit::CodeHolder::setErrorHandler(&this->m_code,in_RCX);
  }
  std::
  unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
  ::unordered_map((unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
                   *)((long)&as.super_Assembler._op5.field_0 + 8));
  asmjit::X86Assembler::X86Assembler(in_stack_fffffffffffff980,in_stack_fffffffffffff978);
  __begin0.
  super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_true>
             )(_Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_true>
               )ctx;
  local_320._M_cur = (__node_type *)Grammar<char>::begin((Grammar<char> *)ctx);
  p = (value_type *)
      Grammar<char>::end((Grammar<char> *)
                         __begin0.
                         super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_true>
                         ._M_cur);
  while( true ) {
    bVar4 = std::__detail::operator!=
                      (&local_320,
                       (_Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_true>
                        *)&p);
    if (!bVar4) break;
    pvVar8 = std::__detail::
             _Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_false,_true>
             ::operator*((_Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_false,_true>
                          *)&local_320);
    local_340 = pvVar8;
    asmjit::Assembler::newLabel(in_stack_fffffffffffff998);
    std::pair<Centaurus::Identifier,_asmjit::Label>::pair<asmjit::Label,_true>
              (&local_378,&pvVar8->first,&local_388);
    std::
    unordered_map<Centaurus::Identifier,asmjit::Label,std::hash<Centaurus::Identifier>,std::equal_to<Centaurus::Identifier>,std::allocator<std::pair<Centaurus::Identifier_const,asmjit::Label>>>
    ::emplace<std::pair<Centaurus::Identifier,asmjit::Label>>
              ((unordered_map<Centaurus::Identifier,asmjit::Label,std::hash<Centaurus::Identifier>,std::equal_to<Centaurus::Identifier>,std::allocator<std::pair<Centaurus::Identifier_const,asmjit::Label>>>
                *)((long)&as.super_Assembler._op5.field_0 + 8),&local_378);
    std::pair<Centaurus::Identifier,_asmjit::Label>::~pair(&local_378);
    std::__detail::
    _Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_false,_true>
    ::operator++((_Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_false,_true>
                  *)&local_320);
  }
  MyConstPool::MyConstPool
            ((MyConstPool *)
             ((long)&skipfilter_mem.super_Mem.super_Operand.super_Operand_.field_0 + 8),
             (X86Assembler *)&__range2);
  DVar13 = pack_charclass((CharClass<char> *)m_skipfilter);
  uVar12 = DVar13.sq[1];
  catn.m_dict._M_h._M_single_bucket = DVar13.sq[0];
  DVar13.sq[1] = (int64_t)catn.m_dict._M_h._M_single_bucket;
  DVar13.sq[0] = (int64_t)((long)&skipfilter_mem.super_Mem.super_Operand.super_Operand_.field_0 + 8)
  ;
  MyConstPool::add((MyConstPool *)local_4c0,DVar13);
  CompositeATN<char>::CompositeATN((CompositeATN<char> *)&__range2_1,(Grammar<char> *)ctx);
  __end0_1 = Grammar<char>::begin((Grammar<char> *)ctx);
  p_1 = (value_type *)Grammar<char>::end((Grammar<char> *)ctx);
  while( true ) {
    __len = (socklen_t)uVar12;
    bVar4 = std::__detail::operator!=
                      (&__end0_1.
                        super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_true>
                       ,(_Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_true>
                         *)&p_1);
    if (!bVar4) break;
    rejectlabel.super_Operand.super_Operand_.field_0._mem.field_2 =
         (anon_union_8_2_78723da6_for_MemData_2)
         std::__detail::
         _Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_false,_true>
         ::operator*(&__end0_1);
    asmjit::Assembler::newLabel(in_stack_fffffffffffff998);
    pmVar6 = std::
             unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
             ::operator[]((unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
                           *)((long)&as.super_Assembler._op5.field_0 + 8),
                          (key_type *)rejectlabel.super_Operand.super_Operand_.field_0._mem.field_2)
    ;
    asmjit::Assembler::bind((Assembler *)&__range2,(int)pmVar6,__addr,__len);
    emit_parser_prolog((X86Assembler *)&__range2);
    local_558 = 0x32;
    local_54c = 4;
    local_550 = 0x20;
    asmjit::CodeEmitter::emit
              ((CodeEmitter *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
               (uint32_t)((ulong)in_stack_fffffffffffff988 >> 0x20),
               (Operand_ *)in_stack_fffffffffffff980,(Operand_ *)in_stack_fffffffffffff978);
    func_base = (char *)0x32;
    local_55c = 4;
    local_560 = 0x18;
    asmjit::CodeEmitter::emit
              ((CodeEmitter *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
               (uint32_t)((ulong)in_stack_fffffffffffff988 >> 0x20),
               (Operand_ *)in_stack_fffffffffffff980,(Operand_ *)in_stack_fffffffffffff978);
    asmjit::CodeEmitter::emit
              ((CodeEmitter *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
               (uint32_t)((ulong)in_stack_fffffffffffff988 >> 0x20),
               (Operand_ *)in_stack_fffffffffffff980,(Operand_ *)in_stack_fffffffffffff978);
    in_stack_fffffffffffff978 =
         (CodeHolder *)((long)&skipfilter_mem.super_Mem.super_Operand.super_Operand_.field_0 + 8);
    uVar12 = rejectlabel.super_Operand.super_Operand_.field_0._mem.field_2;
    emit_machine(this,(X86Assembler *)&__range2,(Grammar<char> *)ctx,
                 (Identifier *)rejectlabel.super_Operand.super_Operand_.field_0._mem.field_2,
                 (CompositeATN<char> *)&__range2_1,(Label *)local_548,
                 (MyConstPool *)in_stack_fffffffffffff978);
    emit_parser_epilog((X86Assembler *)&__range2,(Label *)local_548);
    std::__detail::
    _Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_false,_true>
    ::operator++(&__end0_1);
  }
  MyConstPool::embed((MyConstPool *)
                     ((long)&skipfilter_mem.super_Mem.super_Operand.super_Operand_.field_0 + 8));
  asmjit::CodeEmitter::finalize((CodeEmitter *)&__range2);
  (*(this->m_runtime).super_HostRuntime.super_Runtime._vptr_Runtime[2])
            (&this->m_runtime,&__range2_2,&this->m_code);
  __end0_2 = Grammar<char>::begin((Grammar<char> *)ctx);
  p_2 = (value_type *)Grammar<char>::end((Grammar<char> *)ctx);
  while( true ) {
    bVar4 = std::__detail::operator!=
                      (&__end0_2.
                        super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_true>
                       ,(_Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_true>
                         *)&p_2);
    if (!bVar4) {
      __end0_3 = Grammar<char>::begin((Grammar<char> *)ctx);
      p_3 = (value_type *)Grammar<char>::end((Grammar<char> *)ctx);
      while( true ) {
        bVar4 = std::__detail::operator!=
                          (&__end0_3.
                            super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_true>
                           ,(_Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_true>
                             *)&p_3);
        if (!bVar4) break;
        pvVar8 = std::__detail::
                 _Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_false,_true>
                 ::operator*(&__end0_3);
        iVar5 = ATNMachine<char>::get_unique_id(&pvVar8->second);
        sVar9 = std::
                vector<void_*(*)(void_*,_const_void_*),_std::allocator<void_*(*)(void_*,_const_void_*)>_>
                ::size(&this->m_funcarray);
        if (sVar9 <= (ulong)(long)iVar5) {
          std::
          vector<void_*(*)(void_*,_const_void_*),_std::allocator<void_*(*)(void_*,_const_void_*)>_>
          ::resize(&this->m_funcarray,(long)(iVar5 + 1));
        }
        pp_Var10 = std::
                   unordered_map<Centaurus::Identifier,_void_*(*)(void_*,_const_void_*),_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_void_*(*)(void_*,_const_void_*)>_>_>
                   ::operator[](&this->m_funcmap,&pvVar8->first);
        p_Var14 = *pp_Var10;
        pp_Var11 = std::
                   vector<void_*(*)(void_*,_const_void_*),_std::allocator<void_*(*)(void_*,_const_void_*)>_>
                   ::operator[](&this->m_funcarray,(long)iVar5);
        *pp_Var11 = p_Var14;
        std::__detail::
        _Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_false,_true>
        ::operator++(&__end0_3);
      }
      CompositeATN<char>::~CompositeATN((CompositeATN<char> *)&__range2_1);
      MyConstPool::~MyConstPool
                ((MyConstPool *)
                 ((long)&skipfilter_mem.super_Mem.super_Operand.super_Operand_.field_0 + 8));
      asmjit::X86Assembler::~X86Assembler((X86Assembler *)0x1563ee);
      std::
      unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
      ::~unordered_map((unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
                        *)((long)&as.super_Assembler._op5.field_0 + 8));
      return extraout_EAX;
    }
    pvVar8 = std::__detail::
             _Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_false,_true>
             ::operator*(&__end0_2);
    pGVar3 = __range2_2;
    pmVar6 = std::
             unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
             ::operator[]((unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
                           *)((long)&as.super_Assembler._op5.field_0 + 8),&pvVar8->first);
    uVar1 = (pmVar6->super_Operand).super_Operand_.field_0._any.id;
    if ((this->m_code)._labels.super_ZoneVectorBase._length <= (ulong)(uVar1 - 0x100)) break;
    uVar7 = (ulong)(uVar1 - 0x100);
    if ((this->m_code)._labels.super_ZoneVectorBase._length <= uVar7) {
      asmjit::DebugUtils::assertionFailed
                ((char *)as.super_Assembler._bufferEnd,as.super_Assembler._bufferData._4_4_,
                 (char *)as.super_Assembler._section);
    }
    lVar2 = *(long *)(*(long *)((long)(this->m_code)._labels.super_ZoneVectorBase._data + uVar7 * 8)
                     + 0x20);
    pp_Var10 = std::
               unordered_map<Centaurus::Identifier,_void_*(*)(void_*,_const_void_*),_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_void_*(*)(void_*,_const_void_*)>_>_>
               ::operator[](&this->m_funcmap,&pvVar8->first);
    *pp_Var10 = (mapped_type)((long)&(pGVar3->super_IGrammar)._vptr_IGrammar + lVar2);
    std::__detail::
    _Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_false,_true>
    ::operator++(&__end0_2);
  }
  asmjit::DebugUtils::assertionFailed
            ((char *)as.super_Assembler._bufferEnd,as.super_Assembler._bufferData._4_4_,
             (char *)as.super_Assembler._section);
}

Assistant:

void ChaserEM64T<TCHAR>::init(const Grammar<TCHAR>& grammar, asmjit::Logger *logger, asmjit::ErrorHandler *errhandler)
{
	m_code.init(m_runtime.getCodeInfo());
	if (logger != NULL)
		m_code.setLogger(logger);
	if (errhandler != NULL)
		m_code.setErrorHandler(errhandler);
	
	std::unordered_map<Identifier, asmjit::Label> machinelabels;

	asmjit::X86Assembler as(&m_code);

	for (const auto& p : grammar)
	{
		machinelabels.emplace(std::pair<Identifier, asmjit::Label>(p.first, as.newLabel()));
	}
	
	MyConstPool pool(as);

    asmjit::X86Mem skipfilter_mem = pool.add(pack_charclass(m_skipfilter));

    CompositeATN<TCHAR> catn(grammar);

	for (const auto& p : grammar)
	{
		asmjit::Label rejectlabel = as.newLabel();

		as.bind(machinelabels[p.first]);

		emit_parser_prolog(as);

        as.mov(CONTEXT_REG, asmjit::X86Mem(asmjit::x86::rsp, ARG1_STACK_OFFSET));
        as.mov(INPUT_REG, asmjit::X86Mem(asmjit::x86::rsp, ARG2_STACK_OFFSET));
        as.movdqa(PATTERN_REG, skipfilter_mem);

		emit_machine(as, grammar, p.first, catn, rejectlabel, pool);

		emit_parser_epilog(as, rejectlabel);
	}

	pool.embed();

	as.finalize();

    char *func_base;
	m_runtime.add(&func_base, &m_code);

    for (const auto& p : grammar)
    {
        m_funcmap[p.first] = reinterpret_cast<ChaserFunc>(func_base + m_code.getLabelOffset(machinelabels[p.first]));
    }

    for (const auto& p : grammar)
    {
        int id = p.second.get_unique_id();
        if (m_funcarray.size() <= id)
            m_funcarray.resize(id + 1);
        m_funcarray[id] = m_funcmap[p.first];
    }
}